

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FutureState.h
# Opt level: O2

void __thiscall
async_simple::FutureState<async_simple::Unit>::scheduleContinuation
          (FutureState<async_simple::Unit> *this,bool triggerByContinuation)

{
  bool bVar1;
  Executor *pEVar2;
  char cVar3;
  runtime_error *this_00;
  _Function_base *this_01;
  ContinuationReference guard;
  ContinuationReference local_78;
  ContinuationReference guardForException;
  _Function_base local_68;
  _Function_base local_48;
  int iVar4;
  
  logicAssert((this->_state)._M_i == DONE,"FutureState is not DONE");
  if (this->_forceSched == false) {
    if (this->_executor != (Executor *)0x0 && !triggerByContinuation) {
      iVar4 = (*this->_executor->_vptr_Executor[3])();
      if ((char)iVar4 == '\0') goto LAB_001bb9d9;
    }
    LOCK();
    (this->_attached).super___atomic_base<unsigned_char>._M_i =
         (this->_attached).super___atomic_base<unsigned_char>._M_i + '\x01';
    UNLOCK();
    LOCK();
    (this->_continuationRef).super___atomic_base<unsigned_char>._M_i =
         (this->_continuationRef).super___atomic_base<unsigned_char>._M_i + '\x01';
    UNLOCK();
    guard._fs = this;
    util::move_only_function<void_(async_simple::Try<async_simple::Unit>_&&)>::operator()
              (&(this->field_4)._continuation,&this->_try_value);
  }
  else {
LAB_001bb9d9:
    LOCK();
    (this->_attached).super___atomic_base<unsigned_char>._M_i =
         (this->_attached).super___atomic_base<unsigned_char>._M_i + '\x01';
    UNLOCK();
    LOCK();
    (this->_continuationRef).super___atomic_base<unsigned_char>._M_i =
         (this->_continuationRef).super___atomic_base<unsigned_char>._M_i + '\x01';
    UNLOCK();
    LOCK();
    (this->_attached).super___atomic_base<unsigned_char>._M_i =
         (this->_attached).super___atomic_base<unsigned_char>._M_i + '\x01';
    UNLOCK();
    LOCK();
    (this->_continuationRef).super___atomic_base<unsigned_char>._M_i =
         (this->_continuationRef).super___atomic_base<unsigned_char>._M_i + '\x01';
    UNLOCK();
    local_78._fs = this;
    guardForException._fs = this;
    if (this->_context == (Context)0x0) {
      pEVar2 = this->_executor;
      guard._fs = (FutureState<async_simple::Unit> *)0x0;
      std::function<void()>::
      function<async_simple::FutureState<async_simple::Unit>::scheduleContinuation(bool)::_lambda()_1_,void>
                ((function<void()> *)&local_48,(anon_class_8_1_a7ecd3a6 *)&local_78);
      iVar4 = (*pEVar2->_vptr_Executor[2])(pEVar2,&local_48);
      cVar3 = (char)iVar4;
      this_01 = &local_48;
    }
    else {
      bVar1 = this->_forceSched;
      pEVar2 = this->_executor;
      guard._fs = (FutureState<async_simple::Unit> *)0x0;
      std::function<void()>::
      function<async_simple::FutureState<async_simple::Unit>::scheduleContinuation(bool)::_lambda()_2_,void>
                ((function<void()> *)&local_68,(anon_class_8_1_a7ecd3a6 *)&local_78);
      iVar4 = (*pEVar2->_vptr_Executor[7])(pEVar2,&local_68,this->_context,(ulong)(bVar1 ^ 1));
      cVar3 = (char)iVar4;
      this_01 = &local_68;
    }
    std::_Function_base::~_Function_base(this_01);
    ContinuationReference::~ContinuationReference(&local_78);
    if (cVar3 == '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"schedule continuation in executor failed");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ContinuationReference::~ContinuationReference(&guardForException);
  }
  ContinuationReference::~ContinuationReference(&guard);
  return;
}

Assistant:

void scheduleContinuation(bool triggerByContinuation) {
        logicAssert(
            _state.load(std::memory_order_relaxed) == detail::State::DONE,
            "FutureState is not DONE");
        if (!_forceSched && (!_executor || triggerByContinuation ||
                             currentThreadInExecutor())) {
            // execute inplace for better performance
            ContinuationReference guard(this);
            _continuation(std::move(_try_value));
        } else {
            ContinuationReference guard(this);
            ContinuationReference guardForException(this);
            try {
                bool ret;
                if (Executor::NULLCTX == _context) {
                    ret = _executor->schedule(
                        [fsRef = std::move(guard)]() mutable {
                            auto ref = std::move(fsRef);
                            auto fs = ref.getFutureState();
                            fs->_continuation(std::move(fs->_try_value));
                        });
                } else {
                    ScheduleOptions opts;
                    opts.prompt = !_forceSched;
                    // schedule continuation in the same context before
                    // checkout()
                    ret = _executor->checkin(
                        [fsRef = std::move(guard)]() mutable {
                            auto ref = std::move(fsRef);
                            auto fs = ref.getFutureState();
                            fs->_continuation(std::move(fs->_try_value));
                        },
                        _context, opts);
                }
                if (!ret) {
                    throw std::runtime_error(
                        "schedule continuation in executor failed");
                }
            } catch (std::exception& e) {
                // reschedule failed, execute inplace
                _continuation(std::move(_try_value));
            }
        }
    }